

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

ssize_t __thiscall
cmdline::parser::
option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::read(option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  string *s_local;
  option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(CONCAT44(in_register_00000034,__fd) + 0x98),(string *)__buf);
  return (ssize_t)this;
}

Assistant:

T read(const std::string &s){
                        return reader(s);
                    }